

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IPCMessages.cpp
# Opt level: O3

bool __thiscall gnilk::IPCResultSummary::Unmarshal(IPCResultSummary *this,IPCDecoderBase *decoder)

{
  IPCResultSummary *local_30;
  undefined8 local_28;
  code *local_20;
  code *local_18;
  
  (*(decoder->super_IPCReader)._vptr_IPCReader[7])(decoder,&this->testsExecuted);
  (*(decoder->super_IPCReader)._vptr_IPCReader[7])(decoder,&this->testsFailed);
  (*(decoder->super_IPCReader)._vptr_IPCReader[0xe])(decoder,&this->durationSec);
  local_28 = 0;
  local_18 = std::
             _Function_handler<void_(gnilk::IPCObject_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/gnilk[P]testrunner/src/testrunner/ipc/IPCMessages.cpp:39:23)>
             ::_M_invoke;
  local_20 = std::
             _Function_handler<void_(gnilk::IPCObject_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/gnilk[P]testrunner/src/testrunner/ipc/IPCMessages.cpp:39:23)>
             ::_M_manager;
  local_30 = this;
  (*(decoder->super_IPCReader)._vptr_IPCReader[0x10])(decoder);
  if (local_20 != (code *)0x0) {
    (*local_20)(&local_30,&local_30,3);
  }
  return true;
}

Assistant:

bool IPCResultSummary::Unmarshal(IPCDecoderBase &decoder) {
    decoder.ReadI32(testsExecuted);
    decoder.ReadI32(testsFailed);
    decoder.ReadDouble(durationSec);
    decoder.ReadArray([this](IPCObject *ptrObject) {
       auto tr = dynamic_cast<IPCTestResults *>(ptrObject);
       testResults.push_back(tr);
    });

    return true;
}